

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O2

int readMPS_sparse(char *filename,int mxNumRow,int mxNumCol,int *numRow,int *numCol,int *objSense,
                  double *objOffset,vector<int,_std::allocator<int>_> *Astart,
                  vector<int,_std::allocator<int>_> *Aindex,
                  vector<double,_std::allocator<double>_> *Avalue,
                  vector<double,_std::allocator<double>_> *rhs,
                  vector<double,_std::allocator<double>_> *cost,
                  vector<double,_std::allocator<double>_> *lb,
                  vector<double,_std::allocator<double>_> *ub,
                  vector<int,_std::allocator<int>_> *integerColumn)

{
  size_type __new_size;
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  long lVar9;
  int c_n;
  long lVar10;
  size_type sVar11;
  vector<double,_std::allocator<double>_> rowUpper;
  vector<double,_std::allocator<double>_> rowLower;
  vector<double,_std::allocator<double>_> colUpper;
  vector<double,_std::allocator<double>_> colLower;
  vector<double,_std::allocator<double>_> colCost;
  value_type_conflict1 local_38;
  
  colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar8 = readMPS(filename,mxNumRow,mxNumCol,numRow,numCol,objSense,objOffset,Astart,Aindex,Avalue,
                  &colCost,&colLower,&colUpper,&rowLower,&rowUpper,integerColumn);
  if (iVar8 == 0) {
    printf("readMPS_sparse: Model has %d rows, %d columns and %d nonzeros\n",(ulong)(uint)*numRow,
           (long)*numCol,
           (ulong)(uint)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[*numCol]);
    iVar8 = *numRow;
    sVar11 = (size_type)iVar8;
    iVar1 = *numCol;
    iVar2 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[iVar1];
    lVar10 = (long)iVar2;
    std::vector<int,_std::allocator<int>_>::resize(Astart,sVar11 + 1 + (long)iVar1);
    __new_size = lVar10 + sVar11;
    std::vector<int,_std::allocator<int>_>::resize(Aindex,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(Avalue,__new_size);
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(rhs,sVar11,&local_38);
    sVar11 = (size_type)(iVar1 + iVar8);
    std::vector<double,_std::allocator<double>_>::resize(cost,sVar11);
    std::vector<double,_std::allocator<double>_>::resize(lb,sVar11);
    std::vector<double,_std::allocator<double>_>::resize(ub,sVar11);
    std::vector<int,_std::allocator<int>_>::resize(integerColumn,sVar11);
    piVar3 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    pdVar4 = (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    for (lVar9 = 0; lVar9 < *numRow; lVar9 = lVar9 + 1) {
      piVar5[*numCol + lVar9] = iVar2 + (int)lVar9;
      piVar3[lVar10 + lVar9] = (int)lVar9;
      pdVar4[lVar10 + lVar9] = 1.0;
    }
    (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [sVar11] = (int)__new_size;
    iVar2 = *numCol;
    pdVar4 = (cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (lb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (ub->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar9 = 0; lVar9 < iVar2; lVar9 = lVar9 + 1) {
      pdVar4[lVar9] =
           colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar9];
      pdVar6[lVar9] =
           colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar9];
      pdVar7[lVar9] =
           colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar9];
    }
    pdVar4 = (cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (lb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (ub->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (integerColumn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar9 = 0; lVar9 < *numRow; lVar9 = lVar9 + 1) {
      lVar10 = *numCol + lVar9;
      pdVar4[lVar10] = 0.0;
      pdVar6[lVar10] =
           -rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9];
      pdVar7[lVar10] =
           -rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9];
      piVar3[lVar10] = 0;
    }
    *numRow = iVar8;
    *numCol = iVar1 + iVar8;
    iVar8 = 0;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rowUpper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rowLower.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&colUpper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&colLower.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&colCost.super__Vector_base<double,_std::allocator<double>_>);
  return iVar8;
}

Assistant:

int readMPS_sparse(const char *filename, int mxNumRow, int mxNumCol,
		   int& numRow, int& numCol, int& objSense, double& objOffset,
		   vector<int>& Astart, vector<int>& Aindex, vector<double>& Avalue,
		   vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		   vector<int>& integerColumn) {
  vector<double> colCost;
  vector<double> colLower;
  vector<double> colUpper;
  vector<double> rowLower;
  vector<double> rowUpper;

  int rtCd = readMPS(filename, mxNumRow, mxNumCol,
		     numRow, numCol, objSense, objOffset,
		     Astart,  Aindex, Avalue,
		     colCost, colLower, colUpper,
		     rowLower, rowUpper,
		     integerColumn);
  if (rtCd) return rtCd;
    
#ifdef JAJH_dev
  printf("readMPS_sparse: Model has %d rows, %d columns and %d nonzeros\n", numRow, numCol, Astart[numCol]);
#endif
  //Convert
  //   c^Tx st L <= Ax <= U l <= x <= u
  //to
  //   [c^T 0]x st [A I]x=0 [l -U] <= x <= [u -L]
  //
  int nwNumRow = numRow;
  int nwNumCol = numCol + numRow;
  int numNz = Astart[numCol];
  int nwNumNz = numNz + numRow;
  Astart.resize(nwNumCol+1);
  Aindex.resize(nwNumNz);
  Avalue.resize(nwNumNz);
  rhs.assign(nwNumRow, 0);
  cost.resize(nwNumCol);
  lb.resize(nwNumCol);
  ub.resize(nwNumCol);
  integerColumn.resize(nwNumCol);
  
  for (int r_n=0; r_n<numRow; r_n++) {
    int c_n = numCol+r_n;
    Astart[c_n] = numNz + r_n;
    Aindex[numNz+r_n] = r_n;
    Avalue[numNz+r_n] = 1;
  }
  Astart[nwNumCol] = nwNumNz;
  for (int c_n=0; c_n<numCol; c_n++) {
    cost[c_n] = colCost[c_n];
    lb[c_n] = colLower[c_n];
    ub[c_n] = colUpper[c_n];
  }
  
  for (int r_n=0; r_n<numRow; r_n++) {
    int c_n = numCol+r_n;
    cost[c_n] = 0;
    lb[c_n] = -rowUpper[r_n];
    ub[c_n] = -rowLower[r_n];
    integerColumn[c_n] = 0;
  }
  numRow = nwNumRow;
  numCol = nwNumCol;
  return 0;
}